

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O3

void __thiscall
Net::Net(Net *this,int input_size,int output_size,int hidden_layers_amount,
        vector<int,_std::allocator<int>_> *hidden_layers,int _function_type)

{
  long lVar1;
  int iVar2;
  pointer pvVar3;
  Net *pNVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  size_t __i;
  long lVar6;
  pointer pvVar7;
  ulong uVar8;
  long lVar9;
  size_type sVar10;
  double dVar11;
  mt19937 rnd;
  allocator_type local_1451;
  Net *local_1450;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1448;
  double local_1440;
  vector<double,_std::allocator<double>_> local_1438;
  double local_1420;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1418;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_1410;
  value_type_conflict2 local_1408;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1400;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_13f8;
  vector<int,_std::allocator<int>_> *local_13f0;
  long local_13e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_13e0;
  vector<int,_std::allocator<int>_> *local_13d8;
  Table *local_13d0;
  Table *local_13c8;
  size_type local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this->function_type = SIGMOID;
  this->MOD = 100.0;
  local_13c8 = &this->samples;
  Table::Table(local_13c8);
  local_13d0 = &this->answers;
  Table::Table(local_13d0);
  local_13d8 = &this->shuffler;
  (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1448 = &this->mesh;
  local_13e0 = &this->meshZ;
  local_1418 = &this->biases;
  local_1400 = &this->init_biases;
  local_1410 = &this->weights;
  local_13f8 = &this->init;
  memset(local_1448,0,0x90);
  this->function_type = _function_type;
  local_13b8._M_x[0] = 0x4b;
  lVar6 = 1;
  uVar8 = 0x4b;
  do {
    uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar6);
    local_13b8._M_x[lVar6] = uVar8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_13b8._M_p = 0x270;
  local_1450 = this;
  if (1 < input_size) {
    sVar10 = (size_type)(hidden_layers_amount + 2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_1448,sVar10);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize(local_13f8,sVar10);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize(local_1410,sVar10);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_1400,sVar10);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_1418,sVar10);
    std::vector<double,_std::allocator<double>_>::resize
              ((local_1448->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,(ulong)(uint)input_size);
    sVar10 = (size_type)output_size;
    std::vector<double,_std::allocator<double>_>::resize
              ((local_1450->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,sVar10);
    if (local_1450->function_type == TANH) {
      local_1440 = -1.0;
    }
    else {
      local_1440 = 0.0;
    }
    pvVar7 = (local_1450->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(local_1450->mesh).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7;
    local_13c0 = sVar10;
    if (2 < (int)(uVar8 >> 3) * -0x55555555) {
      local_1420 = 1.0 - local_1440;
      lVar6 = 1;
      local_13f0 = hidden_layers;
      do {
        pvVar5 = local_13f0;
        std::vector<double,_std::allocator<double>_>::resize
                  (pvVar7 + lVar6,
                   (long)(local_13f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar6 + -1]);
        lVar1 = lVar6 + -1;
        pvVar3 = (local_13f8->
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar6 + -1];
        pvVar7 = (local_1448->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1408 = 0.0;
        local_13e8 = lVar6;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_1438,
                   (long)*(pointer *)
                          ((long)&pvVar7[lVar1].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar7[lVar1].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data >> 3,&local_1408,&local_1451);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::_M_fill_assign(pvVar3 + lVar6,(long)iVar2,&local_1438);
        if (local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar3 = (local_1410->
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar2 = (local_13f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_13e8 + -1];
        pvVar7 = (local_1448->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_1438,
                   (long)*(pointer *)
                          ((long)&pvVar7[lVar1].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar7[lVar1].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data >> 3,(allocator_type *)&local_1408);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(pvVar3 + lVar6,(long)iVar2,&local_1438);
        if (local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar9 = local_13e8;
        pvVar5 = local_13f0;
        std::vector<double,_std::allocator<double>_>::resize
                  ((local_1418->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar6,
                   (long)(local_13f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[local_13e8 + -1]);
        std::vector<double,_std::allocator<double>_>::resize
                  ((local_1400->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar6,
                   (long)(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar9 + -1]);
        pvVar7 = (local_1448->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar7[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data + 8) !=
            pvVar7[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar8 = 0;
          do {
            dVar11 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                               (&local_13b8);
            *(double *)
             (*(long *)&(local_1418->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar8 * 8) = dVar11 * local_1420 + local_1440;
            pvVar7 = (local_1448->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (0 < (int)((ulong)((long)*(pointer *)
                                         ((long)&pvVar7[lVar1].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar7[lVar1].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data) >> 3)) {
              lVar9 = 0;
              do {
                dVar11 = std::
                         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                   (&local_13b8);
                *(double *)
                 (*(long *)(*(long *)&(local_1410->
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar6].
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data + uVar8 * 0x18) + lVar9 * 8)
                     = dVar11 * local_1420 + local_1440;
                pvVar7 = (local_1448->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar9 = lVar9 + 1;
              } while (lVar9 < (int)((ulong)((long)*(pointer *)
                                                    ((long)&pvVar7[lVar1].
                                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                            *(long *)&pvVar7[lVar1].
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data) >> 3));
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)((long)*(pointer *)
                                          ((long)&pvVar7[lVar6].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   *(long *)&pvVar7[lVar6].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data >> 3));
        }
        lVar6 = local_13e8 + 1;
        uVar8 = (long)(local_1450->mesh).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7;
      } while (lVar6 < (int)(uVar8 >> 3) * -0x55555555 + -1);
    }
    pvVar3 = (local_1450->weights).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1438,
               *(long *)((long)pvVar7 + (uVar8 - 0x28)) -
               *(long *)((long)&pvVar7[-2].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + uVar8) >> 3,
               (allocator_type *)&local_1408);
    sVar10 = local_13c0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(pvVar3 + -1,local_13c0,&local_1438);
    if (local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar7 = (local_1450->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (local_1450->init).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1408 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1438,
               (long)pvVar7[-2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)pvVar7[-2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_1408,&local_1451);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_fill_assign(pvVar3 + -1,sVar10,&local_1438);
    if (local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pNVar4 = local_1450;
    std::vector<double,_std::allocator<double>_>::resize
              ((local_1450->biases).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,sVar10);
    std::vector<double,_std::allocator<double>_>::resize
              ((pNVar4->init_biases).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,sVar10);
    pvVar7 = (pNVar4->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1420 = 1.0 - local_1440;
      uVar8 = 0;
      do {
        dVar11 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (&local_13b8);
        (local_1450->biases).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar8] = dVar11 * local_1420 + local_1440;
        pvVar7 = (local_1450->mesh).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (0 < (int)((ulong)((long)pvVar7[-2].super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)pvVar7[-2].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar6 = 0;
          do {
            dVar11 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                               (&local_13b8);
            *(double *)
             (*(long *)&(local_1450->weights).
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + lVar6 * 8) = dVar11 * local_1420 + local_1440;
            pvVar7 = (local_1450->mesh).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar6 = lVar6 + 1;
          } while (lVar6 < (int)((ulong)((long)pvVar7[-2].
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pvVar7[-2].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(local_13e0,local_1448);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Minimum input size is 2\n");
  exit(1);
}

Assistant:

Net::Net(int input_size, int output_size, int hidden_layers_amount, const std::vector<int>& hidden_layers, int _function_type) {
    function_type = (FUNCTIONS)_function_type;
    std::mt19937 rnd(75);
    if (input_size < 2){
        std::cerr << "Minimum input size is 2\n";
        exit(EXIT_FAILURE);
    }
    mesh.resize(2 + hidden_layers_amount);
    init.resize(2 + hidden_layers_amount);
    weights.resize(2 + hidden_layers_amount);
    init_biases.resize(2 + hidden_layers_amount);
    biases.resize(2 + hidden_layers_amount);
    mesh[0].resize(input_size);
    mesh.back().resize(output_size);

    auto dist = std::uniform_real_distribution<double>(0.0, 1.0);
    if (function_type == TANH)
        dist = std::uniform_real_distribution<double>(-1.0, 1.0);
    for (int i = 1; i < (int)mesh.size()-1; ++i){
        mesh[i].resize(hidden_layers[i - 1]);
        init[i].assign(hidden_layers[i - 1], std::vector<double>(mesh[i-1].size(), 0));
        weights[i].resize(hidden_layers[i - 1], std::vector<double>(mesh[i-1].size()));
        biases[i].resize(hidden_layers[i - 1]);
        init_biases[i].resize(hidden_layers[i - 1]);
        for (int j = 0; j < mesh[i].size(); ++j) {
            biases[i][j] = dist(rnd);
            for (int x = 0; x < (int) mesh[i - 1].size(); ++x)
                weights[i][j][x] = dist(rnd);
        }
    }
    weights.back().resize(output_size, std::vector<double>(mesh[mesh.size()-2].size()));
    init.back().assign(output_size, std::vector<double>(mesh[mesh.size()-2].size(), 0));
    biases.back().resize(output_size);
    init_biases.back().resize(output_size);
    for (int j = 0; j < mesh.back().size(); ++j) {
        biases.back()[j] = dist(rnd);
        for (int x = 0; x < (int) mesh[mesh.size() - 2].size(); ++x)
            weights.back()[j][x] = dist(rnd);
    }
    meshZ = mesh;
}